

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O1

Var __thiscall
Js::JavascriptProxy::GetValueFromDescriptor
          (JavascriptProxy *this,Var instance,PropertyDescriptor *propertyDescriptor,
          ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  Var pvVar3;
  RecyclableObject *function;
  undefined4 *puVar4;
  
  if (propertyDescriptor->valueSpecified == true) {
    pvVar3 = CrossSite::MarshalVar(requestContext,(propertyDescriptor->Value).ptr,false);
    return pvVar3;
  }
  if (propertyDescriptor->getterSpecified == true) {
    pvVar3 = PropertyDescriptor::GetGetter(propertyDescriptor);
    function = VarTo<Js::RecyclableObject>(pvVar3);
    pvVar3 = JavascriptOperators::CallGetter(function,instance,requestContext);
    return pvVar3;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                              ,0x7ce,"(0)","FALSE");
  if (bVar2) {
    *puVar4 = 0;
    return (((requestContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Var JavascriptProxy::GetValueFromDescriptor(Var instance, PropertyDescriptor propertyDescriptor, ScriptContext* requestContext)
    {
        if (propertyDescriptor.ValueSpecified())
        {
            return CrossSite::MarshalVar(requestContext, propertyDescriptor.GetValue());
        }
        if (propertyDescriptor.GetterSpecified())
        {
            return JavascriptOperators::CallGetter(VarTo<RecyclableObject>(propertyDescriptor.GetGetter()), instance, requestContext);
        }
        Assert(FALSE);
        return requestContext->GetLibrary()->GetUndefined();
    }